

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_udp_ref2(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  int64_t eval_b;
  int64_t eval_b_1;
  sockaddr_in addr;
  uv_udp_t h;
  undefined1 auStack_310 [16];
  undefined1 auStack_300 [16];
  undefined8 auStack_2f0 [23];
  long alStack_238 [41];
  code *pcStack_f0;
  long local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  long local_c0 [23];
  
  pcStack_f0 = (code *)0x1b98ce;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_d0);
  local_c0[0] = (long)iVar1;
  local_e0 = 0;
  if (local_c0[0] == 0) {
    pcStack_f0 = (code *)0x1b98f3;
    uVar2 = uv_default_loop();
    pcStack_f0 = (code *)0x1b9903;
    uv_udp_init(uVar2,local_c0);
    pcStack_f0 = (code *)0x1b9912;
    uv_udp_bind(local_c0,local_d0,0);
    pcStack_f0 = (code *)0x1b9924;
    uv_udp_recv_start(local_c0,fail_cb);
    pcStack_f0 = (code *)0x1b992c;
    uv_unref(local_c0);
    pcStack_f0 = (code *)0x1b9931;
    uVar2 = uv_default_loop();
    pcStack_f0 = (code *)0x1b993b;
    uv_run(uVar2,0);
    pcStack_f0 = (code *)0x1b9943;
    do_close(local_c0);
    pcStack_f0 = (code *)0x1b9948;
    unaff_RBX = uv_default_loop();
    pcStack_f0 = (code *)0x1b995c;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_f0 = (code *)0x1b9966;
    uv_run(unaff_RBX,0);
    local_e0 = 0;
    pcStack_f0 = (code *)0x1b9974;
    uVar2 = uv_default_loop();
    pcStack_f0 = (code *)0x1b997c;
    iVar1 = uv_loop_close(uVar2);
    local_d8 = (long)iVar1;
    if (local_e0 == local_d8) {
      pcStack_f0 = (code *)0x1b9994;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_f0 = (code *)0x1b99ae;
    run_test_udp_ref2_cold_1();
  }
  pcStack_f0 = run_test_udp_ref3;
  run_test_udp_ref2_cold_2();
  pcStack_f0 = (code *)unaff_RBX;
  auStack_310 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_300);
  alStack_238[0] = (long)iVar1;
  auStack_2f0[0] = 0;
  if (alStack_238[0] == 0) {
    uVar2 = uv_default_loop();
    uv_udp_init(uVar2,auStack_2f0);
    uv_udp_send(alStack_238,auStack_2f0,auStack_310,1,auStack_300,req_cb);
    uv_unref(auStack_2f0);
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    if (req_cb_called == 1) {
      do_close(auStack_2f0);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b9b10;
    }
  }
  else {
    run_test_udp_ref3_cold_1();
  }
  run_test_udp_ref3_cold_2();
LAB_001b9b10:
  run_test_udp_ref3_cold_3();
  req_cb_called = req_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(udp_ref2) {
  struct sockaddr_in addr;
  uv_udp_t h;
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_udp_init(uv_default_loop(), &h);
  uv_udp_bind(&h, (const struct sockaddr*) &addr, 0);
  uv_udp_recv_start(&h, (uv_alloc_cb)fail_cb, (uv_udp_recv_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}